

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O2

void argsman_tests::util_NoIncludeConf_invoker(void)

{
  unit_test_log_t *puVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  pointer local_268;
  pointer local_260;
  char *local_258;
  char *local_250;
  pointer local_248;
  pointer local_240;
  char *local_238;
  char *local_230;
  pointer local_228;
  pointer local_220;
  char *local_218;
  char *local_210;
  pointer local_208;
  pointer local_200;
  char *local_1f8;
  char *local_1f0;
  util_NoIncludeConf t;
  pointer local_1e0;
  pointer local_1d8;
  char *local_1d0;
  char *local_1c8;
  basic_wrap_stringstream<char> local_1c0;
  long local_28;
  
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1c8 = "";
  memset(&local_1c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_1c0);
  std::operator<<((ostream *)&local_1c0,'\"');
  std::operator<<((ostream *)&local_1c0,"util_NoIncludeConf");
  std::operator<<((ostream *)&local_1c0,"\" fixture ctor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_1c0);
  local_1e0 = (pbVar2->_M_dataplus)._M_p;
  local_1d8 = local_1e0 + pbVar2->_M_string_length;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0xca;
  file.m_begin = (iterator)&local_1d0;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,file,(size_t)&local_1e0,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_1c0);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_1f0 = "";
  memset(&local_1c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_1c0);
  std::operator<<((ostream *)&local_1c0,'\"');
  std::operator<<((ostream *)&local_1c0,"util_NoIncludeConf");
  std::operator<<((ostream *)&local_1c0,"\" fixture setup");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_1c0);
  local_208 = (pbVar2->_M_dataplus)._M_p;
  local_200 = local_208 + pbVar2->_M_string_length;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  file_00.m_end = (iterator)0xca;
  file_00.m_begin = (iterator)&local_1f8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,file_00,(size_t)&local_208,msg_00);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_1c0);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_210 = "";
  memset(&local_1c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_1c0);
  std::operator<<((ostream *)&local_1c0,'\"');
  std::operator<<((ostream *)&local_1c0,"util_NoIncludeConf");
  std::operator<<((ostream *)&local_1c0,"\" test entry");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_1c0);
  local_228 = (pbVar2->_M_dataplus)._M_p;
  local_220 = local_228 + pbVar2->_M_string_length;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  file_01.m_end = (iterator)0xca;
  file_01.m_begin = (iterator)&local_218;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,file_01,(size_t)&local_228,msg_01);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_1c0);
  util_NoIncludeConf::test_method(&t);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_230 = "";
  memset(&local_1c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_1c0);
  std::operator<<((ostream *)&local_1c0,'\"');
  std::operator<<((ostream *)&local_1c0,"util_NoIncludeConf");
  std::operator<<((ostream *)&local_1c0,"\" fixture teardown");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_1c0);
  local_248 = (pbVar2->_M_dataplus)._M_p;
  local_240 = local_248 + pbVar2->_M_string_length;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  file_02.m_end = (iterator)0xca;
  file_02.m_begin = (iterator)&local_238;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,file_02,(size_t)&local_248,msg_02);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_1c0);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_250 = "";
  memset(&local_1c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_1c0);
  std::operator<<((ostream *)&local_1c0,'\"');
  std::operator<<((ostream *)&local_1c0,"util_NoIncludeConf");
  std::operator<<((ostream *)&local_1c0,"\" fixture dtor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_1c0);
  local_268 = (pbVar2->_M_dataplus)._M_p;
  local_260 = local_268 + pbVar2->_M_string_length;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  file_03.m_end = (iterator)0xca;
  file_03.m_begin = (iterator)&local_258;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,file_03,(size_t)&local_268,msg_03);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_1c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(util_NoIncludeConf, NoIncludeConfTest)
{
    BOOST_CHECK_EQUAL(Parse("-noincludeconf"), "");
    BOOST_CHECK_EQUAL(Parse("-includeconf"), "-includeconf cannot be used from commandline; -includeconf=\"\"");
    BOOST_CHECK_EQUAL(Parse("-includeconf=file"), "-includeconf cannot be used from commandline; -includeconf=\"file\"");
}